

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Scene::Scene(Scene *this,Scene *rhs)

{
  Scene *rhs_local;
  Scene *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)rhs);
  std::vector<int,_std::allocator<int>_>::vector(&this->nodes,&rhs->nodes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&rhs->extensions);
  Value::Value(&this->extras,&rhs->extras);
  return;
}

Assistant:

Scene(Scene &&rhs) noexcept : name(std::move(rhs.name)),
                                nodes(std::move(rhs.nodes)),
                                extensions(std::move(rhs.extensions)),
                                extras(std::move(rhs.extras)) {}